

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O1

int EVP_tls_cbc_digest_record
              (EVP_MD *md,uint8_t *md_out,size_t *md_out_size,uint8_t *header,uint8_t *data,
              size_t data_size,size_t data_plus_mac_plus_padding_size,uint8_t *mac_secret,
              uint mac_secret_length)

{
  int iVar1;
  size_t i;
  long lVar2;
  size_t sVar3;
  SHA_CTX ctx;
  byte local_108 [64];
  uint8_t local_c8 [40];
  SHA256_CTX local_a0;
  
  iVar1 = EVP_MD_type((EVP_MD *)md);
  if (iVar1 == 0x2a0) {
    if (0x40 < mac_secret_length) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                    ,0x192,
                    "int tls_cbc_digest_record_sha256(uint8_t *, size_t *, const uint8_t *, const uint8_t *, size_t, size_t, const uint8_t *, unsigned int)"
                   );
    }
    local_108[0x30] = 0;
    local_108[0x31] = 0;
    local_108[0x32] = 0;
    local_108[0x33] = 0;
    local_108[0x34] = 0;
    local_108[0x35] = 0;
    local_108[0x36] = 0;
    local_108[0x37] = 0;
    local_108[0x38] = 0;
    local_108[0x39] = 0;
    local_108[0x3a] = 0;
    local_108[0x3b] = 0;
    local_108[0x3c] = 0;
    local_108[0x3d] = 0;
    local_108[0x3e] = 0;
    local_108[0x3f] = 0;
    local_108[0x20] = 0;
    local_108[0x21] = 0;
    local_108[0x22] = 0;
    local_108[0x23] = 0;
    local_108[0x24] = 0;
    local_108[0x25] = 0;
    local_108[0x26] = 0;
    local_108[0x27] = 0;
    local_108[0x28] = 0;
    local_108[0x29] = 0;
    local_108[0x2a] = 0;
    local_108[0x2b] = 0;
    local_108[0x2c] = 0;
    local_108[0x2d] = 0;
    local_108[0x2e] = 0;
    local_108[0x2f] = 0;
    local_108[0x10] = 0;
    local_108[0x11] = 0;
    local_108[0x12] = 0;
    local_108[0x13] = 0;
    local_108[0x14] = 0;
    local_108[0x15] = 0;
    local_108[0x16] = 0;
    local_108[0x17] = 0;
    local_108[0x18] = 0;
    local_108[0x19] = 0;
    local_108[0x1a] = 0;
    local_108[0x1b] = 0;
    local_108[0x1c] = 0;
    local_108[0x1d] = 0;
    local_108[0x1e] = 0;
    local_108[0x1f] = 0;
    local_108[0] = 0;
    local_108[1] = 0;
    local_108[2] = 0;
    local_108[3] = 0;
    local_108[4] = 0;
    local_108[5] = 0;
    local_108[6] = 0;
    local_108[7] = 0;
    local_108[8] = 0;
    local_108[9] = 0;
    local_108[10] = 0;
    local_108[0xb] = 0;
    local_108[0xc] = 0;
    local_108[0xd] = 0;
    local_108[0xe] = 0;
    local_108[0xf] = 0;
    if (mac_secret_length != 0) {
      memcpy(local_108,mac_secret,(ulong)mac_secret_length);
    }
    lVar2 = 0;
    do {
      local_108[lVar2] = local_108[lVar2] ^ 0x36;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    SHA256_Init(&local_a0);
    SHA256_Update(&local_a0,local_108,0x40);
    SHA256_Update(&local_a0,header,0xd);
    sVar3 = 0;
    if (0x11f < data_plus_mac_plus_padding_size) {
      sVar3 = data_plus_mac_plus_padding_size - 0x120;
    }
    SHA256_Update(&local_a0,data,sVar3);
    iVar1 = EVP_sha256_final_with_secret_suffix
                      ((SHA256_CTX *)&local_a0,local_c8,data + sVar3,data_size - sVar3,
                       data_plus_mac_plus_padding_size - sVar3);
    if (iVar1 == 0) {
      return 0;
    }
    SHA256_Init(&local_a0);
    lVar2 = 0;
    do {
      local_108[lVar2] = local_108[lVar2] ^ 0x6a;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    SHA256_Update(&local_a0,local_108,0x40);
    SHA256_Update(&local_a0,local_c8,0x20);
    SHA256_Final(md_out,&local_a0);
    *md_out_size = 0x20;
  }
  else {
    if (iVar1 != 0x40) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                    ,0x1d8,
                    "int EVP_tls_cbc_digest_record(const EVP_MD *, uint8_t *, size_t *, const uint8_t *, const uint8_t *, size_t, size_t, const uint8_t *, unsigned int)"
                   );
    }
    if (0x40 < mac_secret_length) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                    ,0x158,
                    "int tls_cbc_digest_record_sha1(uint8_t *, size_t *, const uint8_t *, const uint8_t *, size_t, size_t, const uint8_t *, unsigned int)"
                   );
    }
    local_108[0x30] = 0;
    local_108[0x31] = 0;
    local_108[0x32] = 0;
    local_108[0x33] = 0;
    local_108[0x34] = 0;
    local_108[0x35] = 0;
    local_108[0x36] = 0;
    local_108[0x37] = 0;
    local_108[0x38] = 0;
    local_108[0x39] = 0;
    local_108[0x3a] = 0;
    local_108[0x3b] = 0;
    local_108[0x3c] = 0;
    local_108[0x3d] = 0;
    local_108[0x3e] = 0;
    local_108[0x3f] = 0;
    local_108[0x20] = 0;
    local_108[0x21] = 0;
    local_108[0x22] = 0;
    local_108[0x23] = 0;
    local_108[0x24] = 0;
    local_108[0x25] = 0;
    local_108[0x26] = 0;
    local_108[0x27] = 0;
    local_108[0x28] = 0;
    local_108[0x29] = 0;
    local_108[0x2a] = 0;
    local_108[0x2b] = 0;
    local_108[0x2c] = 0;
    local_108[0x2d] = 0;
    local_108[0x2e] = 0;
    local_108[0x2f] = 0;
    local_108[0x10] = 0;
    local_108[0x11] = 0;
    local_108[0x12] = 0;
    local_108[0x13] = 0;
    local_108[0x14] = 0;
    local_108[0x15] = 0;
    local_108[0x16] = 0;
    local_108[0x17] = 0;
    local_108[0x18] = 0;
    local_108[0x19] = 0;
    local_108[0x1a] = 0;
    local_108[0x1b] = 0;
    local_108[0x1c] = 0;
    local_108[0x1d] = 0;
    local_108[0x1e] = 0;
    local_108[0x1f] = 0;
    local_108[0] = 0;
    local_108[1] = 0;
    local_108[2] = 0;
    local_108[3] = 0;
    local_108[4] = 0;
    local_108[5] = 0;
    local_108[6] = 0;
    local_108[7] = 0;
    local_108[8] = 0;
    local_108[9] = 0;
    local_108[10] = 0;
    local_108[0xb] = 0;
    local_108[0xc] = 0;
    local_108[0xd] = 0;
    local_108[0xe] = 0;
    local_108[0xf] = 0;
    if (mac_secret_length != 0) {
      memcpy(local_108,mac_secret,(ulong)mac_secret_length);
    }
    lVar2 = 0;
    do {
      local_108[lVar2] = local_108[lVar2] ^ 0x36;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    SHA1_Init((SHA_CTX *)&local_a0);
    SHA1_Update((SHA_CTX *)&local_a0,local_108,0x40);
    SHA1_Update((SHA_CTX *)&local_a0,header,0xd);
    sVar3 = 0;
    if (0x113 < data_plus_mac_plus_padding_size) {
      sVar3 = data_plus_mac_plus_padding_size - 0x114;
    }
    SHA1_Update((SHA_CTX *)&local_a0,data,sVar3);
    iVar1 = EVP_sha1_final_with_secret_suffix
                      ((SHA_CTX *)&local_a0,local_c8,data + sVar3,data_size - sVar3,
                       data_plus_mac_plus_padding_size - sVar3);
    if (iVar1 == 0) {
      return 0;
    }
    SHA1_Init((SHA_CTX *)&local_a0);
    lVar2 = 0;
    do {
      local_108[lVar2] = local_108[lVar2] ^ 0x6a;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    SHA1_Update((SHA_CTX *)&local_a0,local_108,0x40);
    SHA1_Update((SHA_CTX *)&local_a0,local_c8,0x14);
    SHA1_Final(md_out,(SHA_CTX *)&local_a0);
    *md_out_size = 0x14;
  }
  return 1;
}

Assistant:

int EVP_tls_cbc_digest_record(const EVP_MD *md, uint8_t *md_out,
                              size_t *md_out_size, const uint8_t header[13],
                              const uint8_t *data, size_t data_size,
                              size_t data_plus_mac_plus_padding_size,
                              const uint8_t *mac_secret,
                              unsigned mac_secret_length) {
  switch (EVP_MD_type(md)) {
    case NID_sha1:
      return tls_cbc_digest_record_sha1(
          md_out, md_out_size, header, data, data_size,
          data_plus_mac_plus_padding_size, mac_secret, mac_secret_length);

    case NID_sha256:
      return tls_cbc_digest_record_sha256(
          md_out, md_out_size, header, data, data_size,
          data_plus_mac_plus_padding_size, mac_secret, mac_secret_length);

    default:
      // EVP_tls_cbc_record_digest_supported should have been called first to
      // check that the hash function is supported.
      assert(0);
      *md_out_size = 0;
      return 0;
  }
}